

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O2

ostream * binlog::operator<<(ostream *out,WriterProp *a)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"WriterProp{");
  poVar1 = std::operator<<(poVar1," id: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," name: ");
  poVar1 = std::operator<<(poVar1,(string *)&a->name);
  poVar1 = std::operator<<(poVar1," batchSize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," }");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const WriterProp& a)
{
  return
  out << "WriterProp{"
      << " id: " << a.id
      << " name: " << a.name
      << " batchSize: " << a.batchSize << " }";
}